

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

void HN::parsePollOpt(ItemData *data,PollOpt *res)

{
  int iVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  int *piVar4;
  long lVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  key_type local_90;
  key_type local_70;
  string local_50;
  
  paVar8 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"by","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(data,&local_90);
  std::__cxx11::string::_M_assign((string *)res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar8) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"id","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_90);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pmVar3->_M_dataplus)._M_p;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(paVar8->_M_local_buf,(char **)&local_70,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar8) {
    std::__throw_invalid_argument("stoi");
LAB_0010d89c:
    std::__throw_invalid_argument("stoi");
LAB_0010d8a8:
    std::__throw_invalid_argument("stoi");
LAB_0010d8b4:
    std::__throw_invalid_argument("stoll");
LAB_0010d8c0:
    std::__throw_out_of_range("stoi");
  }
  else {
    paVar8 = &local_90.field_2;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010d8c0;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    res->id = (ItemId)lVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar8) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"poll","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(data,&local_90);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pmVar3->_M_dataplus)._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(paVar8->_M_local_buf,(char **)&local_70,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar8) goto LAB_0010d89c;
    paVar8 = &local_90.field_2;
    if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      res->poll = (ItemId)lVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar8) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"score","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_90);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pmVar3->_M_dataplus)._M_p;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol(paVar8->_M_local_buf,(char **)&local_70,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar8) goto LAB_0010d8a8;
      paVar8 = &local_90.field_2;
      if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010d8d8;
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      res->score = (int)lVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar8) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"time","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_90);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pmVar3->_M_dataplus)._M_p;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      uVar6 = strtoll(paVar8->_M_local_buf,(char **)&local_70,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar8) {
        if (*piVar4 != 0) {
          if (*piVar4 != 0x22) goto LAB_0010d7b4;
          uVar6 = std::__throw_out_of_range("stoll");
        }
        *piVar4 = iVar1;
LAB_0010d7b4:
        res->time = uVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"text","");
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(data,&local_70);
        pcVar2 = (pmVar3->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + pmVar3->_M_string_length);
        parseHTML(&local_90,&local_50);
        std::__cxx11::string::operator=((string *)&res->text,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return;
      }
      goto LAB_0010d8b4;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0010d8d8:
  uVar7 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar8) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((int *)local_70._M_dataplus._M_p != piVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __cxa_begin_catch(uVar7);
  std::__cxx11::string::operator=((string *)&res->text,"");
  __cxa_end_catch();
  return;
}

Assistant:

void parsePollOpt(const ItemData & data, PollOpt & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.poll = std::stoi(data.at("poll"));
        } catch (...) {
            res.poll = 0;
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.text = parseHTML(data.at("text"));
        } catch (...) {
            res.text = "";
        }
    }